

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall arealights::Application::onRender(Application *this)

{
  allocator<arealights::PolygonalLight> *this_00;
  allocator<unsigned_char> *this_01;
  mat4 modelMatrix;
  mat4 viewMatrix_00;
  mat4 projectionMatrix;
  mat4 modelMatrix_00;
  mat4 viewMatrix_01;
  mat4 projectionMatrix_00;
  mat4 transformation;
  mat4 transformation_00;
  mat4 transformation_01;
  initializer_list<arealights::PolygonalLight> __l;
  vec3 color;
  initializer_list<arealights::PolygonalLight> __l_00;
  vec3 color_00;
  initializer_list<arealights::PolygonalLight> __l_01;
  PFNGLBINDFRAMEBUFFERPROC p_Var1;
  PFNGLREADPIXELSPROC p_Var2;
  GLsizei GVar3;
  int iVar4;
  uint uVar5;
  EArealightMethod EVar6;
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0 *paVar7
  ;
  element_type *this_02;
  pointer pDVar8;
  reference pvVar9;
  element_type *this_03;
  element_type *peVar10;
  pointer pMVar11;
  element_type *peVar12;
  Writer *pWVar13;
  element_type *peVar14;
  element_type *peVar15;
  pointer pSVar16;
  element_type *this_04;
  ostream *poVar17;
  tm *__tmb;
  long lVar18;
  uchar *puVar19;
  reference __a;
  reference __b;
  char *filename;
  element_type *this_05;
  element_type *this_06;
  tvec3<float,_(glm::precision)0> *in_RCX;
  sockaddr *__addr;
  size_type __n;
  unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
  *this_07;
  Interface *this_08;
  shared_ptr<arealights::LinearlyTransformedCosines> *this_09;
  shared_ptr<arealights::PointLightCluster> *this_10;
  shared_ptr<arealights::GroundTruth> *this_11;
  float fVar20;
  float fovy;
  rep rVar21;
  float fVar22;
  _Put_time<char> __f;
  vec3 vVar23;
  PolygonalLight *local_1130;
  PolygonalLight *local_10c8;
  PolygonalLight *local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  Writer local_ee8;
  string local_e78 [36];
  int local_e54;
  int local_e50;
  int i;
  int targetBase;
  int sourceBase;
  int x;
  int y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> orig;
  undefined1 local_e20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int stride;
  stringstream local_df0 [8];
  stringstream ss;
  ostream local_de0 [376];
  string local_c68 [32];
  anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 local_c48;
  ivec2 clusterSize;
  stringstream ss_1;
  ostream local_c30 [383];
  allocator<char> local_ab1;
  string local_ab0 [8];
  string methodName;
  time_t in_time_t;
  time_point now;
  duration<float,_std::ratio<1L,_1L>_> local_a74;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a70;
  time_point frameRenderingEnd;
  string local_a60;
  allocator<arealights::PolygonalLight> local_a39;
  undefined8 local_a38;
  float local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_9dc;
  PolygonalLight *local_9d0;
  PolygonalLight local_9c8;
  undefined1 local_960 [48];
  float lightArea;
  vec2 lightSize;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_8cc;
  PolygonalLight *local_8c0;
  PolygonalLight local_8b8;
  undefined1 local_850 [55];
  allocator<arealights::PolygonalLight> local_819 [25];
  col_type cStack_800;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_7bc;
  PolygonalLight *local_7b0;
  PolygonalLight local_7a8;
  undefined1 local_740 [52];
  uint colorBuffer;
  uint normalBuffer;
  uint positionBuffer;
  byte local_691;
  uint local_690;
  EArealightMethod EStack_68c;
  bool isIncremental;
  GLbitfield clearMask;
  EArealightMethod mode;
  ivec2 gbufferResolution;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640 [4];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_600 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [12];
  tmat4x4<float,_(glm::precision)0> local_5b4;
  undefined1 local_574 [8];
  tmat4x4<float,_(glm::precision)0> planeUpMatrix;
  undefined1 local_52c [12];
  tmat4x4<float,_(glm::precision)0> local_520;
  tmat4x4<float,_(glm::precision)0> local_4e0;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [68];
  tmat4x4<float,_(glm::precision)0> local_44c;
  undefined1 local_40c [20];
  glm local_3f8 [64];
  tmat4x4<float,_(glm::precision)0> local_3b8;
  undefined8 local_378;
  float local_370;
  undefined1 local_368 [76];
  tmat4x4<float,_(glm::precision)0> local_31c;
  tmat4x4<float,_(glm::precision)0> local_2dc;
  tmat4x4<float,_(glm::precision)0> local_29c;
  undefined1 auStack_25c [8];
  tmat4x4<float,_(glm::precision)0> lightWorldMatrix;
  undefined1 local_1f8 [24];
  string local_1e0;
  undefined1 local_1c0 [40];
  string local_198;
  DeferredRenderingPipeline local_178;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_e8 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [8];
  tmat4x4<float,_(glm::precision)0> projMatrix;
  mat4 viewMatrix;
  time_point frameRenderingStart;
  int iStack_18;
  float aspectRatio;
  ivec2 framebufferSize;
  Application *this_local;
  
  framebufferSize.field_0 = (anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2)this;
  paVar7 = (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0
            *)fw::OpenGLApplication::getFramebufferSize((OpenGLApplication *)this);
  _iStack_18 = *paVar7;
  fVar20 = (float)iStack_18;
  fVar22 = (float)(int)aspectRatio;
  viewMatrix.value[3].field_0._8_8_ = std::chrono::_V2::system_clock::now();
  this_02 = std::__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_camera);
  fw::FreeCamera::getViewMatrix((mat4 *)((long)&projMatrix.value[3].field_0 + 8),this_02);
  fovy = glm::radians<float>(45.0);
  glm::perspective<float>
            ((tmat4x4<float,_(glm::precision)0> *)auStack_a8,fovy,fVar20 / fVar22,0.1,100.0);
  this_07 = &this->_deferredPipeline;
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(this_07);
  DeferredRenderingPipeline::startGeometryPass(pDVar8);
  (*glad_glEnable)(0xb71);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(this_07);
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4
            ((tmat4x4<float,_(glm::precision)0> *)&local_e8[0].field_0);
  modelMatrix.value[0].field_0.field_0.z = (float)(int)local_e8[0]._8_8_;
  modelMatrix.value[0].field_0._0_8_ = local_e8[0]._0_8_;
  modelMatrix.value[0].field_0.field_0.w = (float)(int)((ulong)local_e8[0]._8_8_ >> 0x20);
  modelMatrix.value[1].field_0.field_0.x = (float)(int)local_e8[1]._0_8_;
  modelMatrix.value[1].field_0.field_0.y = (float)(int)((ulong)local_e8[1]._0_8_ >> 0x20);
  modelMatrix.value[1].field_0.field_0.z = (float)(int)local_e8[1]._8_8_;
  modelMatrix.value[1].field_0.field_0.w = (float)(int)((ulong)local_e8[1]._8_8_ >> 0x20);
  modelMatrix.value[2].field_0._0_8_ = local_c8;
  modelMatrix.value[2].field_0._8_8_ = uStack_c0;
  modelMatrix.value[3].field_0._0_8_ = local_b8;
  modelMatrix.value[3].field_0._8_8_ = uStack_b0;
  DeferredRenderingPipeline::setModelMatrix(pDVar8,modelMatrix);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(this_07);
  local_f8 = viewMatrix.value[2].field_0._8_8_;
  uStack_f0 = viewMatrix.value[3].field_0._0_8_;
  local_108 = viewMatrix.value[1].field_0._8_8_;
  uStack_100 = viewMatrix.value[2].field_0._0_8_;
  local_118 = viewMatrix.value[0].field_0._8_8_;
  uStack_110 = viewMatrix.value[1].field_0._0_8_;
  local_128 = projMatrix.value[3].field_0._8_8_;
  uStack_120 = viewMatrix.value[0].field_0._0_8_;
  viewMatrix_00.value[0].field_0.field_0.z = (float)(int)viewMatrix.value[0].field_0._0_8_;
  viewMatrix_00.value[0].field_0._0_8_ = projMatrix.value[3].field_0._8_8_;
  viewMatrix_00.value[0].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[0].field_0._0_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.x = (float)(int)viewMatrix.value[0].field_0._8_8_;
  viewMatrix_00.value[1].field_0.field_0.y =
       (float)(int)((ulong)viewMatrix.value[0].field_0._8_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.z = (float)(int)viewMatrix.value[1].field_0._0_8_;
  viewMatrix_00.value[1].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[1].field_0._0_8_ >> 0x20);
  viewMatrix_00.value[2].field_0._0_8_ = viewMatrix.value[1].field_0._8_8_;
  viewMatrix_00.value[2].field_0._8_8_ = viewMatrix.value[2].field_0._0_8_;
  viewMatrix_00.value[3].field_0._0_8_ = viewMatrix.value[2].field_0._8_8_;
  viewMatrix_00.value[3].field_0._8_8_ = viewMatrix.value[3].field_0._0_8_;
  DeferredRenderingPipeline::setViewMatrix(pDVar8,viewMatrix_00);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(this_07);
  local_138 = projMatrix.value[2].field_0._8_8_;
  uStack_130 = projMatrix.value[3].field_0._0_8_;
  local_148 = projMatrix.value[1].field_0._8_8_;
  uStack_140 = projMatrix.value[2].field_0._0_8_;
  local_178._geometryPassShader.super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)projMatrix.value[0].field_0._8_8_;
  local_178._geometryPassShader.super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)projMatrix.value[1].field_0._0_8_;
  local_178._gBuffer = auStack_a8._0_4_;
  local_178._gPosition = auStack_a8._4_4_;
  local_178._gNormal = projMatrix.value[0].field_0._0_4_;
  local_178._gColor = projMatrix.value[0].field_0._4_4_;
  projectionMatrix.value[0].field_0.field_0.z = (float)(int)projMatrix.value[0].field_0._0_8_;
  projectionMatrix.value[0].field_0._0_8_ = auStack_a8;
  projectionMatrix.value[0].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[0].field_0._0_8_ >> 0x20);
  projectionMatrix.value[1].field_0.field_0.x = (float)(int)projMatrix.value[0].field_0._8_8_;
  projectionMatrix.value[1].field_0.field_0.y =
       (float)(int)((ulong)projMatrix.value[0].field_0._8_8_ >> 0x20);
  projectionMatrix.value[1].field_0.field_0.z = (float)(int)projMatrix.value[1].field_0._0_8_;
  projectionMatrix.value[1].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[1].field_0._0_8_ >> 0x20);
  projectionMatrix.value[2].field_0._0_8_ = projMatrix.value[1].field_0._8_8_;
  projectionMatrix.value[2].field_0._8_8_ = projMatrix.value[2].field_0._0_8_;
  projectionMatrix.value[3].field_0._0_8_ = projMatrix.value[2].field_0._8_8_;
  projectionMatrix.value[3].field_0._8_8_ = projMatrix.value[3].field_0._0_8_;
  DeferredRenderingPipeline::setProjectionMatrix(pDVar8,projectionMatrix);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(this_07);
  DeferredRenderingPipeline::setMaterialID(pDVar8,0.1);
  iVar4 = Interface::getMaterialId(&this->_interface);
  __n = (size_type)iVar4;
  pvVar9 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
           ::operator[](&this->_materialMap,__n);
  iVar4 = (int)__n;
  this_03 = std::__shared_ptr_access<Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Material,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &pvVar9->second);
  Material::bind(this_03,iVar4,__addr,(socklen_t)in_RCX);
  std::
  unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
  ::operator->(this_07);
  DeferredRenderingPipeline::getShader(&local_178);
  peVar10 = std::__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"SolidMode",(allocator<char> *)(local_1c0 + 0x27));
  iVar4 = Interface::getSceneId(&this->_interface);
  fw::ShaderProgram::setUniform(peVar10,&local_198,iVar4);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x27));
  std::shared_ptr<fw::ShaderProgram>::~shared_ptr((shared_ptr<fw::ShaderProgram> *)&local_178);
  std::
  unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
  ::operator->(&this->_deferredPipeline);
  DeferredRenderingPipeline::getShader((DeferredRenderingPipeline *)local_1c0);
  peVar10 = std::__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"MetalnessConst",(allocator<char> *)(local_1f8 + 0x17));
  fVar20 = Interface::getMetalness(&this->_interface);
  fw::ShaderProgram::setUniform(peVar10,&local_1e0,fVar20);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_1f8 + 0x17));
  std::shared_ptr<fw::ShaderProgram>::~shared_ptr((shared_ptr<fw::ShaderProgram> *)local_1c0);
  std::
  unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
  ::operator->(&this->_deferredPipeline);
  DeferredRenderingPipeline::getShader((DeferredRenderingPipeline *)local_1f8);
  peVar10 = std::__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(lightWorldMatrix.value[3].field_0.data.data + 0xc),"RoughnessConst",
             (allocator<char> *)(lightWorldMatrix.value[3].field_0.data.data + 0xb));
  fVar20 = Interface::getRoughness(&this->_interface);
  fw::ShaderProgram::setUniform
            (peVar10,(string *)((long)&lightWorldMatrix.value[3].field_0 + 0xc),fVar20);
  std::__cxx11::string::~string((string *)(lightWorldMatrix.value[3].field_0.data.data + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(lightWorldMatrix.value[3].field_0.data.data + 0xb));
  std::shared_ptr<fw::ShaderProgram>::~shared_ptr((shared_ptr<fw::ShaderProgram> *)local_1f8);
  pMVar11 = std::
            unique_ptr<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
            ::operator->(&this->_planeMesh);
  (*(pMVar11->super_IMesh)._vptr_IMesh[3])();
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4
            ((tmat4x4<float,_(glm::precision)0> *)(local_368 + 0xc));
  this_08 = &this->_interface;
  vVar23 = Interface::getPosition(this_08);
  local_370 = vVar23.field_0._8_4_;
  local_378 = vVar23.field_0._0_8_;
  local_368._0_8_ = local_378;
  local_368._8_4_ = local_370;
  glm::translate<float,(glm::precision)0>
            (&local_31c,(glm *)(local_368 + 0xc),(tmat4x4<float,_(glm::precision)0> *)local_368,
             in_RCX);
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4((tmat4x4<float,_(glm::precision)0> *)local_3f8);
  local_40c._12_8_ = Interface::getRotation(this_08);
  fVar20 = glm::radians<float>((float)local_40c._12_4_);
  glm::tvec3<float,_(glm::precision)0>::tvec3
            ((tvec3<float,_(glm::precision)0> *)local_40c,1.0,0.0,0.0);
  glm::rotate<float,(glm::precision)0>
            (&local_3b8,local_3f8,(tmat4x4<float,_(glm::precision)0> *)local_40c,fVar20,in_RCX);
  glm::operator*(&local_2dc,&local_31c,&local_3b8);
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4
            ((tmat4x4<float,_(glm::precision)0> *)(auStack_490 + 4));
  unique0x10000da6 =
       (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
       )Interface::getRotation(this_08);
  fVar20 = glm::radians<float>((float)auStack_490._0_4_);
  glm::tvec3<float,_(glm::precision)0>::tvec3
            ((tvec3<float,_(glm::precision)0> *)local_4a0,0.0,1.0,0.0);
  glm::rotate<float,(glm::precision)0>
            (&local_44c,(glm *)(auStack_490 + 4),(tmat4x4<float,_(glm::precision)0> *)local_4a0,
             fVar20,in_RCX);
  glm::operator*(&local_29c,&local_2dc,&local_44c);
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4(&local_520);
  planeUpMatrix.value[3].field_0._8_8_ = Interface::getSize(this_08);
  glm::tvec3<float,(glm::precision)0>::tvec3<float,float,(glm::precision)0>
            ((tvec3<float,(glm::precision)0> *)local_52c,
             (tvec2<float,_(glm::precision)0> *)((long)&planeUpMatrix.value[3].field_0 + 8),1.0);
  glm::scale<float,(glm::precision)0>
            (&local_4e0,(glm *)&local_520,(tmat4x4<float,_(glm::precision)0> *)local_52c,in_RCX);
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)auStack_25c,&local_29c,&local_4e0);
  glm::tmat4x4<float,_(glm::precision)0>::tmat4x4(&local_5b4);
  fVar20 = glm::radians<float>(90.0);
  glm::tvec3<float,_(glm::precision)0>::tvec3
            ((tvec3<float,_(glm::precision)0> *)local_5c0,1.0,0.0,0.0);
  glm::rotate<float,(glm::precision)0>
            ((tmat4x4<float,_(glm::precision)0> *)local_574,(glm *)&local_5b4,
             (tmat4x4<float,_(glm::precision)0> *)local_5c0,fVar20,in_RCX);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&local_600[0].field_0,
                 (tmat4x4<float,_(glm::precision)0> *)auStack_25c,
                 (tmat4x4<float,_(glm::precision)0> *)local_574);
  modelMatrix_00.value[0].field_0.field_0.z = (float)(int)local_600[0]._8_8_;
  modelMatrix_00.value[0].field_0._0_8_ = local_600[0]._0_8_;
  modelMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)local_600[0]._8_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.x = (float)(int)local_600[1]._0_8_;
  modelMatrix_00.value[1].field_0.field_0.y = (float)(int)((ulong)local_600[1]._0_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.z = (float)(int)local_600[1]._8_8_;
  modelMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)local_600[1]._8_8_ >> 0x20);
  modelMatrix_00.value[2].field_0._0_8_ = local_5e0;
  modelMatrix_00.value[2].field_0._8_8_ = uStack_5d8;
  modelMatrix_00.value[3].field_0._0_8_ = local_5d0;
  modelMatrix_00.value[3].field_0._8_8_ = uStack_5c8;
  DeferredRenderingPipeline::setModelMatrix(pDVar8,modelMatrix_00);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  memcpy(local_640,(void *)((long)&projMatrix.value[3].field_0 + 8),0x40);
  viewMatrix_01.value[0].field_0.field_0.z = (float)(int)local_640[1];
  viewMatrix_01.value[0].field_0._0_8_ = local_640[0];
  viewMatrix_01.value[0].field_0.field_0.w = (float)(int)((ulong)local_640[1] >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.x = (float)(int)local_640[2];
  viewMatrix_01.value[1].field_0.field_0.y = (float)(int)((ulong)local_640[2] >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.z = (float)(int)local_640[3];
  viewMatrix_01.value[1].field_0.field_0.w = (float)(int)((ulong)local_640[3] >> 0x20);
  viewMatrix_01.value[2].field_0._0_8_ = local_620;
  viewMatrix_01.value[2].field_0._8_8_ = uStack_618;
  viewMatrix_01.value[3].field_0._0_8_ = local_610;
  viewMatrix_01.value[3].field_0._8_8_ = uStack_608;
  DeferredRenderingPipeline::setViewMatrix(pDVar8,viewMatrix_01);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  memcpy(&gbufferResolution,auStack_a8,0x40);
  projectionMatrix_00.value[0].field_0.field_0.z = (float)(int)uStack_678;
  projectionMatrix_00.value[0].field_0._0_8_ = gbufferResolution.field_0;
  projectionMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)uStack_678 >> 0x20);
  projectionMatrix_00.value[1].field_0.field_0.x = (float)(int)local_670;
  projectionMatrix_00.value[1].field_0.field_0.y = (float)(int)((ulong)local_670 >> 0x20);
  projectionMatrix_00.value[1].field_0.field_0.z = (float)(int)uStack_668;
  projectionMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)uStack_668 >> 0x20);
  projectionMatrix_00.value[2].field_0._0_8_ = local_660;
  projectionMatrix_00.value[2].field_0._8_8_ = uStack_658;
  projectionMatrix_00.value[3].field_0._0_8_ = local_650;
  projectionMatrix_00.value[3].field_0._8_8_ = uStack_648;
  DeferredRenderingPipeline::setProjectionMatrix(pDVar8,projectionMatrix_00);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  DeferredRenderingPipeline::setMaterialID(pDVar8,0.3);
  pMVar11 = std::
            unique_ptr<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
            ::operator->(&this->_arealightMesh);
  (*(pMVar11->super_IMesh)._vptr_IMesh[3])();
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  DeferredRenderingPipeline::endGeometryPass(pDVar8);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  _clearMask = (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0
                )DeferredRenderingPipeline::getFramebufferSize(pDVar8);
  EStack_68c = Interface::getArealightMethod(&this->_interface);
  (*glad_glBindFramebuffer)(0x8d40,this->_intermediateFBO);
  (*glad_glViewport)(0,0,clearMask,mode);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  local_690 = 0x100;
  local_691 = EStack_68c == AREALIGHT_GROUNDTRUTH;
  if ((EStack_68c == AREALIGHT_GROUNDTRUTH) && ((this->_restartIncrementalRendering & 1U) != 0)) {
    peVar12 = std::
              __shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_groundTruth);
    GroundTruth::restartIncrementalRendering(peVar12);
    el::base::Writer::Writer
              ((Writer *)&normalBuffer,Info,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
               ,0x197,"virtual void arealights::Application::onRender()",NormalLog,0);
    pWVar13 = el::base::Writer::construct((Writer *)&normalBuffer,1,"framework");
    el::base::Writer::operator<<(pWVar13,(char (*) [33])"Restarting incremental rendering");
    el::base::Writer::~Writer((Writer *)&normalBuffer);
  }
  if (((local_691 & 1) == 0) || ((this->_restartIncrementalRendering & 1U) != 0)) {
    local_690 = local_690 | 0x4000;
    this->_restartIncrementalRendering = false;
  }
  (*glad_glClear)(local_690);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  colorBuffer = DeferredRenderingPipeline::getPositionBuffer(pDVar8);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  local_740._48_4_ = DeferredRenderingPipeline::getNormalBuffer(pDVar8);
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  local_740._44_4_ = DeferredRenderingPipeline::getColorBuffer(pDVar8);
  p_Var1 = glad_glBindFramebuffer;
  pDVar8 = std::
           unique_ptr<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ::operator->(&this->_deferredPipeline);
  uVar5 = DeferredRenderingPipeline::getFramebuffer(pDVar8);
  (*p_Var1)(0x8ca8,uVar5);
  (*glad_glBindFramebuffer)(0x8ca9,this->_intermediateFBO);
  (*glad_glBlitFramebuffer)(0,0,clearMask,mode,0,0,clearMask,mode,0x100,0x2600);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,local_740._44_4_);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,local_740._48_4_);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,colorBuffer);
  if (EStack_68c == AREALIGHT_DISABLED) {
    renderClusters(this);
  }
  else if (EStack_68c == AREALIGHT_LTC) {
    this_09 = &this->_ltc;
    peVar14 = std::
              __shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_09);
    fVar20 = Interface::getFlux(&this->_interface);
    LinearlyTransformedCosines::setFlux(peVar14,fVar20);
    peVar14 = std::
              __shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_09);
    LinearlyTransformedCosines::setCamera(peVar14,(mat4 *)((long)&projMatrix.value[3].field_0 + 8));
    peVar14 = std::
              __shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_09);
    local_7b0 = &local_7a8;
    glm::tvec3<float,_(glm::precision)0>::tvec3
              ((tvec3<float,_(glm::precision)0> *)&local_7bc.field_0,1.0,1.0,1.0);
    local_7d8 = lightWorldMatrix.value[2].field_0._8_8_;
    uStack_7d0 = lightWorldMatrix.value[3].field_0._0_8_;
    local_7e8 = lightWorldMatrix.value[1].field_0._8_8_;
    uStack_7e0 = lightWorldMatrix.value[2].field_0._0_8_;
    cStack_800.field_0._8_8_ = lightWorldMatrix.value[0].field_0._8_8_;
    uStack_7f0 = lightWorldMatrix.value[1].field_0._0_8_;
    local_819[0x11] = (allocator<arealights::PolygonalLight>)auStack_25c[0];
    local_819[0x12] = (allocator<arealights::PolygonalLight>)auStack_25c[1];
    local_819[0x13] = (allocator<arealights::PolygonalLight>)auStack_25c[2];
    local_819[0x14] = (allocator<arealights::PolygonalLight>)auStack_25c[3];
    local_819[0x15] = (allocator<arealights::PolygonalLight>)auStack_25c[4];
    local_819[0x16] = (allocator<arealights::PolygonalLight>)auStack_25c[5];
    local_819[0x17] = (allocator<arealights::PolygonalLight>)auStack_25c[6];
    local_819[0x18] = (allocator<arealights::PolygonalLight>)auStack_25c[7];
    cStack_800.field_0._0_8_ = lightWorldMatrix.value[0].field_0._0_8_;
    local_819._9_4_ = local_7bc.field_0.z;
    local_819[1] = (allocator<arealights::PolygonalLight>)local_7bc._0_1_;
    local_819[2] = (allocator<arealights::PolygonalLight>)local_7bc._1_1_;
    local_819[3] = (allocator<arealights::PolygonalLight>)local_7bc._2_1_;
    local_819[4] = (allocator<arealights::PolygonalLight>)local_7bc._3_1_;
    local_819[5] = (allocator<arealights::PolygonalLight>)local_7bc._4_1_;
    local_819[6] = (allocator<arealights::PolygonalLight>)local_7bc._5_1_;
    local_819[7] = (allocator<arealights::PolygonalLight>)local_7bc._6_1_;
    local_819[8] = (allocator<arealights::PolygonalLight>)local_7bc._7_1_;
    color_00.field_0.field_0.z = local_7bc.field_0.z;
    color_00.field_0._0_8_ = local_7bc._0_8_;
    transformation.value[0].field_0.field_0.z = (float)(int)lightWorldMatrix.value[0].field_0._0_8_;
    transformation.value[0].field_0._0_8_ = auStack_25c;
    transformation.value[0].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    transformation.value[1].field_0.field_0.x = (float)(int)lightWorldMatrix.value[0].field_0._8_8_;
    transformation.value[1].field_0.field_0.y =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    transformation.value[1].field_0.field_0.z = (float)(int)lightWorldMatrix.value[1].field_0._0_8_;
    transformation.value[1].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    transformation.value[2].field_0._0_8_ = lightWorldMatrix.value[1].field_0._8_8_;
    transformation.value[2].field_0._8_8_ = lightWorldMatrix.value[2].field_0._0_8_;
    transformation.value[3].field_0._0_8_ = lightWorldMatrix.value[2].field_0._8_8_;
    transformation.value[3].field_0._8_8_ = lightWorldMatrix.value[3].field_0._0_8_;
    PolygonalLight::PolygonalLight(&local_7a8,color_00,transformation);
    local_740._0_8_ = &local_7a8;
    local_740._8_8_ = (pointer)0x1;
    std::allocator<arealights::PolygonalLight>::allocator(local_819);
    __l_01._M_len = local_740._8_8_;
    __l_01._M_array = (iterator)local_740._0_8_;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_740 + 0x10),__l_01,local_819);
    LinearlyTransformedCosines::setLights
              (peVar14,(vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>
                        *)(local_740 + 0x10));
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_740 + 0x10));
    std::allocator<arealights::PolygonalLight>::~allocator(local_819);
    local_1058 = (PolygonalLight *)local_740;
    do {
      local_1058 = local_1058 + -1;
      PolygonalLight::~PolygonalLight(local_1058);
    } while (local_1058 != &local_7a8);
    peVar14 = std::
              __shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_ltc);
    LinearlyTransformedCosines::render(peVar14);
  }
  else if (EStack_68c == AREALIGHT_CLUSTER) {
    this_10 = &this->_pointLightCluster;
    peVar15 = std::
              __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_10);
    fVar20 = Interface::getFlux(&this->_interface);
    PointLightCluster::setLightFlux(peVar15,fVar20);
    peVar15 = std::
              __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_10);
    local_850._44_8_ = Interface::getClusterSize(&this->_interface);
    PointLightCluster::setClusterSize(peVar15,(ivec2 *)(local_850 + 0x2c));
    peVar15 = std::
              __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_10);
    PointLightCluster::setCamera
              (peVar15,(mat4 *)((long)&projMatrix.value[3].field_0 + 8),(mat4 *)auStack_a8);
    peVar15 = std::
              __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_10);
    local_8c0 = &local_8b8;
    glm::tvec3<float,_(glm::precision)0>::tvec3
              ((tvec3<float,_(glm::precision)0> *)&local_8cc.field_0,1.0,1.0,1.0);
    stack0xfffffffffffff6d8 = local_8cc._0_8_;
    color.field_0.field_0.z = local_8cc.field_0.z;
    color.field_0._0_8_ = local_8cc._0_8_;
    transformation_00.value[0].field_0.field_0.z =
         (float)(int)lightWorldMatrix.value[0].field_0._0_8_;
    transformation_00.value[0].field_0._0_8_ = auStack_25c;
    transformation_00.value[0].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    transformation_00.value[1].field_0.field_0.x =
         (float)(int)lightWorldMatrix.value[0].field_0._8_8_;
    transformation_00.value[1].field_0.field_0.y =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    transformation_00.value[1].field_0.field_0.z =
         (float)(int)lightWorldMatrix.value[1].field_0._0_8_;
    transformation_00.value[1].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    transformation_00.value[2].field_0._0_8_ = lightWorldMatrix.value[1].field_0._8_8_;
    transformation_00.value[2].field_0._8_8_ = lightWorldMatrix.value[2].field_0._0_8_;
    transformation_00.value[3].field_0._0_8_ = lightWorldMatrix.value[2].field_0._8_8_;
    transformation_00.value[3].field_0._8_8_ = lightWorldMatrix.value[3].field_0._0_8_;
    PolygonalLight::PolygonalLight(&local_8b8,color,transformation_00);
    local_850._0_8_ = &local_8b8;
    local_850._8_8_ = (pointer)0x1;
    this_00 = (allocator<arealights::PolygonalLight> *)((long)&lightSize.field_0 + 3);
    std::allocator<arealights::PolygonalLight>::allocator(this_00);
    __l_00._M_len = local_850._8_8_;
    __l_00._M_array = (iterator)local_850._0_8_;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_850 + 0x10),__l_00,this_00);
    PointLightCluster::setLights
              (peVar15,(vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>
                        *)(local_850 + 0x10));
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_850 + 0x10));
    std::allocator<arealights::PolygonalLight>::~allocator
              ((allocator<arealights::PolygonalLight> *)((long)&lightSize.field_0 + 3));
    local_10c8 = (PolygonalLight *)local_850;
    do {
      local_10c8 = local_10c8 + -1;
      PolygonalLight::~PolygonalLight(local_10c8);
    } while (local_10c8 != &local_8b8);
    peVar15 = std::
              __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_pointLightCluster);
    PointLightCluster::render(peVar15);
  }
  else if (EStack_68c == AREALIGHT_GROUNDTRUTH) {
    unique0x10000dd6 = Interface::getSize(&this->_interface);
    local_960._40_4_ = (float)local_960._44_4_ * lightArea;
    this_11 = &this->_groundTruth;
    peVar12 = std::
              __shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_11);
    fVar20 = Interface::getFlux(&this->_interface);
    GroundTruth::setRadiosity(peVar12,fVar20 / (float)local_960._40_4_);
    peVar12 = std::
              __shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_11);
    GroundTruth::setCamera
              (peVar12,(mat4 *)((long)&projMatrix.value[3].field_0 + 8),(mat4 *)auStack_a8);
    peVar12 = std::
              __shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_11);
    local_9d0 = &local_9c8;
    glm::tvec3<float,_(glm::precision)0>::tvec3
              ((tvec3<float,_(glm::precision)0> *)&local_9dc.field_0,1.0,1.0,1.0);
    local_9f8 = lightWorldMatrix.value[2].field_0._8_8_;
    uStack_9f0 = lightWorldMatrix.value[3].field_0._0_8_;
    local_a08 = lightWorldMatrix.value[1].field_0._8_8_;
    uStack_a00 = lightWorldMatrix.value[2].field_0._0_8_;
    local_a18 = lightWorldMatrix.value[0].field_0._8_8_;
    uStack_a10 = lightWorldMatrix.value[1].field_0._0_8_;
    local_a28 = auStack_25c;
    uStack_a20 = lightWorldMatrix.value[0].field_0._0_8_;
    local_a30 = local_9dc.field_0.z;
    local_a38 = local_9dc._0_8_;
    vVar23.field_0.field_0.z = local_9dc.field_0.z;
    vVar23.field_0._0_8_ = local_9dc._0_8_;
    transformation_01.value[0].field_0.field_0.z =
         (float)(int)lightWorldMatrix.value[0].field_0._0_8_;
    transformation_01.value[0].field_0._0_8_ = auStack_25c;
    transformation_01.value[0].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    transformation_01.value[1].field_0.field_0.x =
         (float)(int)lightWorldMatrix.value[0].field_0._8_8_;
    transformation_01.value[1].field_0.field_0.y =
         (float)(int)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    transformation_01.value[1].field_0.field_0.z =
         (float)(int)lightWorldMatrix.value[1].field_0._0_8_;
    transformation_01.value[1].field_0.field_0.w =
         (float)(int)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    transformation_01.value[2].field_0._0_8_ = lightWorldMatrix.value[1].field_0._8_8_;
    transformation_01.value[2].field_0._8_8_ = lightWorldMatrix.value[2].field_0._0_8_;
    transformation_01.value[3].field_0._0_8_ = lightWorldMatrix.value[2].field_0._8_8_;
    transformation_01.value[3].field_0._8_8_ = lightWorldMatrix.value[3].field_0._0_8_;
    PolygonalLight::PolygonalLight(&local_9c8,vVar23,transformation_01);
    local_960._0_8_ = &local_9c8;
    local_960._8_8_ = (pointer)0x1;
    std::allocator<arealights::PolygonalLight>::allocator(&local_a39);
    __l._M_len = local_960._8_8_;
    __l._M_array = (iterator)local_960._0_8_;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_960 + 0x10),__l,&local_a39);
    GroundTruth::setLights
              (peVar12,(vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>
                        *)(local_960 + 0x10));
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              ((vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> *)
               (local_960 + 0x10));
    std::allocator<arealights::PolygonalLight>::~allocator(&local_a39);
    local_1130 = (PolygonalLight *)local_960;
    do {
      local_1130 = local_1130 + -1;
      PolygonalLight::~PolygonalLight(local_1130);
    } while (local_1130 != &local_9c8);
    peVar12 = std::
              __shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_groundTruth);
    GroundTruth::render(peVar12);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glViewport)(0,0,iStack_18,(GLsizei)aspectRatio);
  (*glad_glClearColor)(0.007,0.11,0.15,1.0);
  (*glad_glClear)(0x4100);
  pSVar16 = std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator->
                      (&this->_blitSRGBProgram);
  fw::ShaderProgram::use(pSVar16);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,this->_intermediateFBOTexture);
  pSVar16 = std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator->
                      (&this->_blitSRGBProgram);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a60,"TargetTexture",
             (allocator<char> *)((long)&frameRenderingEnd.__d.__r + 7));
  fw::ShaderProgram::setUniform(pSVar16,&local_a60,0);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&frameRenderingEnd.__d.__r + 7));
  this_04 = std::
            __shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_renderHelper);
  RenderHelper::drawFullScreenQuad(this_04);
  local_a70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  now.__d.__r = std::chrono::operator-
                          (&local_a70,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)((long)&viewMatrix.value[3].field_0 + 8));
  std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<float,std::ratio<1l,1l>> *)&local_a74,&now.__d);
  rVar21 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_a74);
  this->_frameTimeMs = rVar21 * 1000.0;
  if (this->_frame % 0x14 == 0) {
    Interface::setRenderTimeMs(&this->_interface,this->_frameTimeMs);
  }
  if ((this->_screenshotRequested & 1U) != 0) {
    in_time_t = std::chrono::_V2::system_clock::now();
    methodName.field_2._8_8_ = std::chrono::_V2::system_clock::to_time_t((time_point *)&in_time_t);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_ab0,"",&local_ab1);
    std::allocator<char>::~allocator(&local_ab1);
    EVar6 = Interface::getArealightMethod(&this->_interface);
    switch(EVar6) {
    case AREALIGHT_DISABLED:
      std::__cxx11::string::operator=(local_ab0,"disabled");
      break;
    case AREALIGHT_CLUSTER:
      std::__cxx11::stringstream::stringstream((stringstream *)&clusterSize);
      peVar15 = std::
                __shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->_pointLightCluster);
      local_c48.field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0
            )PointLightCluster::getClusterSize(peVar15);
      poVar17 = std::operator<<(local_c30,"point");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_c48._0_4_);
      poVar17 = std::operator<<(poVar17,"x");
      std::ostream::operator<<(poVar17,local_c48._4_4_);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_ab0,local_c68);
      std::__cxx11::string::~string(local_c68);
      std::__cxx11::stringstream::~stringstream((stringstream *)&clusterSize);
      break;
    case AREALIGHT_GROUNDTRUTH:
      std::__cxx11::string::operator=(local_ab0,"gt");
      break;
    case AREALIGHT_LTC:
      std::__cxx11::string::operator=(local_ab0,"ltc");
    }
    std::__cxx11::stringstream::stringstream(local_df0);
    std::operator<<(local_de0,local_ab0);
    poVar17 = std::operator<<(local_de0,"-flux-");
    fVar20 = Interface::getFlux(&this->_interface);
    std::ostream::operator<<(poVar17,fVar20);
    poVar17 = std::operator<<(local_de0,"-roughness-");
    fVar20 = Interface::getRoughness(&this->_interface);
    std::ostream::operator<<(poVar17,fVar20);
    __tmb = localtime((time_t *)(methodName.field_2._M_local_buf + 8));
    __f = std::put_time<char>((tm *)__tmb,"-%Y-%m-%d-%H-%M-%S");
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_de0,__f);
    lVar18 = std::__cxx11::string::length();
    if (lVar18 != 0) {
      poVar17 = std::operator<<(local_de0,"-");
      std::operator<<(poVar17,(string *)&this->_screenshotAnnotation);
    }
    std::operator<<(local_de0,".png");
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = iStack_18 * 3;
    iVar4 = iStack_18 * (int)aspectRatio;
    this_01 = (allocator<unsigned_char> *)
              ((long)&orig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_char>::allocator(this_01);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20,(long)(iVar4 * 3),
               this_01);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&orig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    (*glad_glPixelStorei)(0xd05,1);
    p_Var2 = glad_glReadPixels;
    GVar3 = iStack_18;
    fVar20 = aspectRatio;
    puVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20);
    (*p_Var2)(0,0,GVar3,(GLsizei)fVar20,0x1907,0x1401,puVar19);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20);
    for (sourceBase = 0; sourceBase < (int)aspectRatio / 2; sourceBase = sourceBase + 1) {
      for (targetBase = 0; targetBase < iStack_18; targetBase = targetBase + 1) {
        i = (iStack_18 * sourceBase + targetBase) * 3;
        local_e50 = (iStack_18 * (((int)aspectRatio - sourceBase) + -1) + targetBase) * 3;
        for (local_e54 = 0; local_e54 < 3; local_e54 = local_e54 + 1) {
          __a = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20,
                           (long)(i + local_e54));
          __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20,
                           (long)(local_e50 + local_e54));
          std::swap<unsigned_char>(__a,__b);
        }
      }
    }
    std::__cxx11::stringstream::str();
    filename = (char *)std::__cxx11::string::c_str();
    iVar4 = iStack_18;
    fVar20 = aspectRatio;
    puVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20);
    stbi_write_png(filename,iVar4,(int)fVar20,3,puVar19,
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
    std::__cxx11::string::~string(local_e78);
    el::base::Writer::Writer
              (&local_ee8,Info,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
               ,0x220,"virtual void arealights::Application::onRender()",NormalLog,0);
    pWVar13 = el::base::Writer::construct(&local_ee8,1,"framework");
    pWVar13 = el::base::Writer::operator<<(pWVar13,(char (*) [21])"Screenshot saved in ");
    std::__cxx11::stringstream::str();
    pWVar13 = el::base::Writer::operator<<(pWVar13,&local_f08);
    pWVar13 = el::base::Writer::operator<<(pWVar13,(char (*) [2])0x21a361);
    pWVar13 = el::base::Writer::operator<<(pWVar13,&stack0xffffffffffffffe8);
    pWVar13 = el::base::Writer::operator<<(pWVar13,(char (*) [2])0x23a6d8);
    el::base::Writer::operator<<(pWVar13,(int *)&aspectRatio);
    std::__cxx11::string::~string((string *)&local_f08);
    el::base::Writer::~Writer(&local_ee8);
    this->_screenshotRequested = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e20);
    std::__cxx11::stringstream::~stringstream(local_df0);
    std::__cxx11::string::~string(local_ab0);
  }
  fw::ImGuiApplication::onRender(&this->super_ImGuiApplication);
  this_05 = std::
            __shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_keyboardInput);
  fw::GenericKeyboardInput::nextFrame(this_05);
  this_06 = std::
            __shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_mouseInput);
  fw::GenericMouseInput::nextFrame(this_06);
  return;
}

Assistant:

void Application::onRender()
{
    auto framebufferSize = getFramebufferSize();
    auto aspectRatio = static_cast<float>(framebufferSize.x) / framebufferSize.y;

    auto frameRenderingStart = std::chrono::high_resolution_clock::now();

    auto viewMatrix = _camera->getViewMatrix();
    auto projMatrix = glm::perspective(glm::radians(45.0f), aspectRatio, 0.1f, 100.0f);

    _deferredPipeline->startGeometryPass();

    glEnable(GL_DEPTH_TEST);

    _deferredPipeline->setModelMatrix({});
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.1f);

    _materialMap[_interface.getMaterialId()].second->bind();

    _deferredPipeline->getShader()->setUniform("SolidMode", _interface.getSceneId());
    _deferredPipeline->getShader()->setUniform("MetalnessConst", _interface.getMetalness());
    _deferredPipeline->getShader()->setUniform("RoughnessConst", _interface.getRoughness());

    _planeMesh->render();

    auto lightWorldMatrix = glm::translate({}, _interface.getPosition()) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().x),
            glm::vec3{1.0f, 0.0f, 0.0f}
        ) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().y),
            glm::vec3{0.0f, 1.0f, 0.0f}
        ) *
        glm::scale({}, glm::vec3{_interface.getSize(), 1.0f});

    auto planeUpMatrix = glm::rotate(glm::mat4{}, glm::radians(90.0f), glm::vec3{1.0f, 0.0f, 0.0f});
    _deferredPipeline->setModelMatrix(lightWorldMatrix * planeUpMatrix);
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.3f);
    _arealightMesh->render();

    _deferredPipeline->endGeometryPass();

    auto gbufferResolution = _deferredPipeline->getFramebufferSize();

    auto mode = _interface.getArealightMethod();

    glBindFramebuffer(GL_FRAMEBUFFER, _intermediateFBO);
    glViewport(0, 0, gbufferResolution.x, gbufferResolution.y);
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

    GLbitfield clearMask = GL_DEPTH_BUFFER_BIT;

    const auto isIncremental = (mode == AREALIGHT_GROUNDTRUTH);

    if (mode == AREALIGHT_GROUNDTRUTH && _restartIncrementalRendering) {
        _groundTruth->restartIncrementalRendering();
        LOG(INFO) << "Restarting incremental rendering";
    }

    if (!isIncremental || _restartIncrementalRendering)
    {
        clearMask |= GL_COLOR_BUFFER_BIT;
        _restartIncrementalRendering = false;
    }

    glClear(clearMask);

    auto positionBuffer = _deferredPipeline->getPositionBuffer();
    auto normalBuffer = _deferredPipeline->getNormalBuffer();
    auto colorBuffer = _deferredPipeline->getColorBuffer();

    glBindFramebuffer(GL_READ_FRAMEBUFFER, _deferredPipeline->getFramebuffer());
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, _intermediateFBO);

    glBlitFramebuffer(
        0, 0, gbufferResolution.x, gbufferResolution.y,
        0, 0, gbufferResolution.x, gbufferResolution.y,
        GL_DEPTH_BUFFER_BIT,
        GL_NEAREST
    );

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, colorBuffer);

    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normalBuffer);

    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, positionBuffer);

    if (mode == AREALIGHT_DISABLED)
    {
        renderClusters();
    }
    else if (mode == AREALIGHT_LTC)
    {
        _ltc->setFlux(_interface.getFlux());
        _ltc->setCamera(viewMatrix);
        _ltc->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _ltc->render();
    }
    else if (mode == AREALIGHT_CLUSTER)
    {
        _pointLightCluster->setLightFlux(_interface.getFlux());
        _pointLightCluster->setClusterSize(_interface.getClusterSize());
        _pointLightCluster->setCamera(viewMatrix, projMatrix);
        _pointLightCluster->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _pointLightCluster->render();
    }
    else if (mode == AREALIGHT_GROUNDTRUTH)
    {
        auto lightSize = _interface.getSize();
        auto lightArea = lightSize.x * lightSize.y;
        _groundTruth->setRadiosity(_interface.getFlux() / lightArea);
        _groundTruth->setCamera(viewMatrix, projMatrix);
        _groundTruth->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _groundTruth->render();
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glViewport(0, 0, framebufferSize.x, framebufferSize.y);
    glClearColor(0.007f, 0.11f, 0.15f, 1.0f);
    glClear(GL_DEPTH_BUFFER_BIT | GL_COLOR_BUFFER_BIT);

    _blitSRGBProgram->use();

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, _intermediateFBOTexture);
    _blitSRGBProgram->setUniform("TargetTexture", 0);

    _renderHelper->drawFullScreenQuad();

    auto frameRenderingEnd = std::chrono::high_resolution_clock::now();
    _frameTimeMs = std::chrono::duration<float>(frameRenderingEnd - frameRenderingStart).count() * 1000;

    if (_frame % 20 == 0) {
        _interface.setRenderTimeMs(_frameTimeMs);
    }

    if (_screenshotRequested) {
        auto now = std::chrono::system_clock::now();
        auto in_time_t = std::chrono::system_clock::to_time_t(now);

        std::string methodName = "";
        switch (_interface.getArealightMethod()) {
        case AREALIGHT_DISABLED:
            methodName = "disabled";
            break;
        case AREALIGHT_CLUSTER:
        {
            std::stringstream ss;
            auto clusterSize = _pointLightCluster->getClusterSize();
            ss << "point" << clusterSize.x << "x" << clusterSize.y;
            methodName = ss.str();
            break;
        }
        case AREALIGHT_GROUNDTRUTH:
            methodName = "gt";
            break;
        case AREALIGHT_LTC:
            methodName = "ltc";
            break;
        }

        std::stringstream ss;
        ss << methodName;
        ss << "-flux-" << _interface.getFlux();
        ss << "-roughness-" << _interface.getRoughness();
        ss << std::put_time(std::localtime(&in_time_t), "-%Y-%m-%d-%H-%M-%S");
        if (_screenshotAnnotation.length() > 0) {
            ss << "-" << _screenshotAnnotation;
        }
        ss << ".png";

        int stride = 3 * sizeof(unsigned char) * framebufferSize.x;
        std::vector<unsigned char> data(3 * framebufferSize.x * framebufferSize.y);
        glPixelStorei(GL_PACK_ALIGNMENT, 1);
        glReadPixels(0, 0, framebufferSize.x, framebufferSize.y, GL_RGB, GL_UNSIGNED_BYTE, data.data());
        std::vector<unsigned char> orig = data;

        // We have to flip image to save it correctly.
        for (int y = 0; y < framebufferSize.y/2; ++y) {
            for (int x = 0; x < framebufferSize.x; ++x) {
                auto sourceBase = 3 * (framebufferSize.x * y + x);
                auto targetBase = 3 * (framebufferSize.x * (framebufferSize.y - y - 1) + x);
                for (int i = 0; i < 3; ++i) {
                    std::swap(data[sourceBase + i], data[targetBase + i]);
                }
            }
        }

        stbi_write_png(ss.str().c_str(), framebufferSize.x, framebufferSize.y, 3, data.data(), stride);

        LOG(INFO) << "Screenshot saved in " << ss.str() << " " << framebufferSize.x << "x" << framebufferSize.y;

        _screenshotRequested = false;
    }

    ImGuiApplication::onRender();

    // buffers are swapped after onRender by default

    _keyboardInput->nextFrame();
    _mouseInput->nextFrame();
}